

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGDefaultTypeCheck
              (void *data,xmlChar *type,xmlChar *value,void **result,xmlNodePtr node)

{
  int iVar1;
  xmlNodePtr node_local;
  void **result_local;
  xmlChar *value_local;
  xmlChar *type_local;
  void *data_local;
  
  if (value == (xmlChar *)0x0) {
    data_local._4_4_ = -1;
  }
  else {
    iVar1 = xmlStrEqual(type,"string");
    if (iVar1 == 0) {
      iVar1 = xmlStrEqual(type,(xmlChar *)"token");
      if (iVar1 == 0) {
        data_local._4_4_ = 0;
      }
      else {
        data_local._4_4_ = 1;
      }
    }
    else {
      data_local._4_4_ = 1;
    }
  }
  return data_local._4_4_;
}

Assistant:

static int
xmlRelaxNGDefaultTypeCheck(void *data ATTRIBUTE_UNUSED,
                           const xmlChar * type ATTRIBUTE_UNUSED,
                           const xmlChar * value ATTRIBUTE_UNUSED,
                           void **result ATTRIBUTE_UNUSED,
                           xmlNodePtr node ATTRIBUTE_UNUSED)
{
    if (value == NULL)
        return (-1);
    if (xmlStrEqual(type, BAD_CAST "string"))
        return (1);
    if (xmlStrEqual(type, BAD_CAST "token")) {
        return (1);
    }

    return (0);
}